

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

void free_multi_response(void *client_data)

{
  int *piVar1;
  response_instance_conflict resp;
  
  piVar1 = (int *)((long)client_data + 0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (*(long *)((long)client_data + 0x18) != 0) {
    cod_code_free();
  }
  if (*(long *)((long)client_data + 0x20) != 0) {
    cod_exec_context_free();
  }
  free(client_data);
  return;
}

Assistant:

static void
free_multi_response(void *client_data)
{
    response_instance resp = (response_instance) client_data;
    resp->u.queued.ref_count--;
    if (resp->u.queued.ref_count != 0) return;
    if (resp->u.queued.code) cod_code_free(resp->u.queued.code);
    if (resp->u.queued.ec) cod_exec_context_free(resp->u.queued.ec);
    free(resp);
}